

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O1

void duckdb::StringValueResult::AddPossiblyEscapedValue
               (StringValueResult *result,idx_t buffer_pos,char *value_ptr,idx_t length,bool empty)

{
  idx_t *col_idx;
  idx_t *chunk_idx;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char escape;
  char quote;
  CSVStateMachine *pCVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  reference pvVar5;
  ostream *poVar6;
  reference pvVar7;
  LogicalTypeId type;
  __string_type error_string;
  string_t value;
  string local_208;
  string local_1e8;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [4];
  char acStack_1a4 [108];
  ios_base local_138 [264];
  
  if ((result->super_ScannerResult).escaped == true) {
    if ((result->projecting_columns == true) &&
       ((result->projected_columns).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
        super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
        super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
        super__Head_base<0UL,_bool_*,_false>._M_head_impl[result->cur_col_id] == false)) {
      result->cur_col_id = result->cur_col_id + 1;
      goto LAB_01813e8c;
    }
    if (((ulong)result->number_of_columns <= result->cur_col_id) &&
       ((((result->super_ScannerResult).state_machine)->state_machine_options).strict_mode.value !=
        true)) {
      return;
    }
    bVar4 = HandleTooManyColumnsError(result,value_ptr,length);
    if (bVar4) goto LAB_01813e8c;
    pvVar5 = vector<duckdb::Vector,_true>::operator[]
                       (&(result->parse_chunk).data,result->chunk_col_id);
    LogicalType::LogicalType((LogicalType *)local_1a8,VARCHAR);
    bVar4 = LogicalType::operator==(&pvVar5->type,(LogicalType *)local_1a8);
    LogicalType::~LogicalType((LogicalType *)local_1a8);
    if (!bVar4) {
      col_idx = &result->cur_col_id;
      chunk_idx = &result->chunk_col_id;
      auVar3[0xf] = 0;
      auVar3._0_15_ = stack0xfffffffffffffe59;
      _local_1a8 = (anon_union_16_2_67f50693_for_value)(auVar3 << 8);
      LineError::Insert(&result->current_errors,local_1a8,col_idx,chunk_idx,
                        &(result->super_ScannerResult).last_position,0);
      bVar4 = CSVReaderOptions::IgnoreErrors(((result->super_ScannerResult).state_machine)->options)
      ;
      if (!bVar4) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Could not convert string \"",0x1a);
        paVar1 = &local_208.field_2;
        local_208._M_dataplus._M_p = (pointer)paVar1;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_208,value_ptr,value_ptr + length);
        poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_208._M_dataplus._M_p,
                            local_208._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" to \'",6);
        LogicalTypeIdToString_abi_cxx11_
                  (&local_1e8,
                   (duckdb *)
                   (ulong)*(LogicalTypeId *)
                           ((long)((result->parse_types).
                                   super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                   ._M_t.
                                   super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                   .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>.
                                   _M_head_impl + result->chunk_col_id) + 1),type);
        poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != paVar1) {
          operator_delete(local_208._M_dataplus._M_p);
        }
        ::std::__cxx11::stringbuf::str();
        FullLinePosition::SanitizeError(&local_208);
        local_1c8[0] = local_1b8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1c8,local_208._M_dataplus._M_p,
                   local_208._M_dataplus._M_p + local_208._M_string_length);
        pvVar7 = vector<duckdb::CurrentError,_true>::back(&(result->current_errors).current_errors);
        ::std::__cxx11::string::operator=((string *)&pvVar7->error_message,(string *)local_1c8);
        if (local_1c8[0] != local_1b8) {
          operator_delete(local_1c8[0]);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != paVar1) {
          operator_delete(local_208._M_dataplus._M_p);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        ::std::ios_base::~ios_base(local_138);
      }
      *col_idx = *col_idx + 1;
      *chunk_idx = *chunk_idx + 1;
      goto LAB_01813e8c;
    }
    pCVar2 = (result->super_ScannerResult).state_machine;
    escape = (pCVar2->dialect_options).state_machine_options.escape.value;
    quote = (pCVar2->dialect_options).state_machine_options.quote.value;
    bVar4 = (pCVar2->dialect_options).state_machine_options.strict_mode.value;
    pvVar5 = vector<duckdb::Vector,_true>::operator[]
                       (&(result->parse_chunk).data,result->chunk_col_id);
    _local_1a8 = (anon_struct_16_3_d7536bce_for_pointer)
                 StringValueScanner::RemoveEscape(value_ptr,length,escape,quote,bVar4,pvVar5);
    length = (idx_t)local_1a8;
    value_ptr = acStack_1a4;
    if (0xc < length) {
      value_ptr = local_1a8._8_8_;
    }
  }
  else if (empty) {
    _local_1a8 = (anon_union_16_2_67f50693_for_value)ZEXT816(0);
    length = 0;
    value_ptr = acStack_1a4;
  }
  AddValueToVector(result,value_ptr,length,false);
LAB_01813e8c:
  (result->super_ScannerResult).escaped = false;
  return;
}

Assistant:

void StringValueResult::AddPossiblyEscapedValue(StringValueResult &result, const idx_t buffer_pos,
                                                const char *value_ptr, const idx_t length, const bool empty) {
	if (result.escaped) {
		if (result.projecting_columns) {
			if (!result.projected_columns[result.cur_col_id]) {
				result.cur_col_id++;
				result.escaped = false;
				return;
			}
		}
		if (result.cur_col_id >= result.number_of_columns &&
		    !result.state_machine.state_machine_options.strict_mode.GetValue()) {
			return;
		}
		if (!result.HandleTooManyColumnsError(value_ptr, length)) {
			// If it's an escaped value we have to remove all the escapes, this is not really great
			// If we are going to escape, this vector must be a varchar vector
			if (result.parse_chunk.data[result.chunk_col_id].GetType() != LogicalType::VARCHAR) {
				result.current_errors.Insert(CAST_ERROR, result.cur_col_id, result.chunk_col_id, result.last_position);
				if (!result.state_machine.options.IgnoreErrors()) {
					// We have to write the cast error message.
					std::ostringstream error;
					// Casting Error Message
					error << "Could not convert string \"" << std::string(value_ptr, length) << "\" to \'"
					      << LogicalTypeIdToString(result.parse_types[result.chunk_col_id].type_id) << "\'";
					auto error_string = error.str();
					FullLinePosition::SanitizeError(error_string);
					result.current_errors.ModifyErrorMessageOfLastError(error_string);
				}
				result.cur_col_id++;
				result.chunk_col_id++;
			} else {
				auto value = StringValueScanner::RemoveEscape(
				    value_ptr, length, result.state_machine.dialect_options.state_machine_options.escape.GetValue(),
				    result.state_machine.dialect_options.state_machine_options.quote.GetValue(),
				    result.state_machine.dialect_options.state_machine_options.strict_mode.GetValue(),
				    result.parse_chunk.data[result.chunk_col_id]);
				result.AddValueToVector(value.GetData(), value.GetSize());
			}
		}
	} else {
		if (empty) {
			// empty value
			auto value = string_t();
			result.AddValueToVector(value.GetData(), value.GetSize());
		} else {
			result.AddValueToVector(value_ptr, length);
		}
	}
	result.escaped = false;
}